

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O2

void __thiscall Future<void>::Private::ThreadPool::~ThreadPool(ThreadPool *this)

{
  LockFreeQueue<Future<void>::Private::ThreadPool::Job> *this_00;
  FastSignal *this_01;
  Item *pIVar1;
  bool bVar2;
  Job *__stat_loc;
  Item *pIVar3;
  Job job;
  Job local_48;
  
  local_48.proc = (_func_void_void_ptr *)0x0;
  local_48.args = (void *)0x0;
  pIVar1 = (this->_threads)._end.item;
  pIVar3 = (this->_threads)._begin.item;
  this_00 = &this->_queue;
  this_01 = &this->_dequeuedSignal;
  do {
    if (pIVar3 == pIVar1) {
      pIVar1 = (this->_threads)._end.item;
      for (pIVar3 = (this->_threads)._begin.item; pIVar3 != pIVar1; pIVar3 = pIVar3->next) {
        Thread::join((Thread *)(pIVar3 + 1));
      }
      PoolList<Future<void>::Private::ThreadPool::ThreadContext>::~PoolList(&this->_threads);
      Mutex::~Mutex(&this->_mutex);
      Signal::~Signal(&(this->_enqueuedSignal)._signal);
      Signal::~Signal(&this_01->_signal);
      LockFreeQueue<Future<void>::Private::ThreadPool::Job>::~LockFreeQueue(this_00);
      return;
    }
    while( true ) {
      bVar2 = LockFreeQueue<Future<void>::Private::ThreadPool::Job>::push(this_00,&local_48);
      if (bVar2) break;
      FastSignal::reset(this_01);
      __stat_loc = &local_48;
      bVar2 = LockFreeQueue<Future<void>::Private::ThreadPool::Job>::push(this_00,&local_48);
      if (bVar2) break;
      FastSignal::wait(this_01,__stat_loc);
    }
    FastSignal::set(&this->_enqueuedSignal);
    pIVar3 = pIVar3->next;
  } while( true );
}

Assistant:

~ThreadPool()
    {
      Job job = {0, 0};
      for (PoolList<ThreadContext>::Iterator i = _threads.begin(), end = _threads.end(); i != end; ++i)
      {
        while (!_queue.push(job))
        {
          _dequeuedSignal.reset();
          if (_queue.push(job))
            break;
          _dequeuedSignal.wait();
        }
        _enqueuedSignal.set();
      }
      for (PoolList<ThreadContext>::Iterator i = _threads.begin(), end = _threads.end(); i != end; ++i)
        i->_thread.join();
    }